

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *cp)

{
  void *pvVar1;
  long lVar2;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoQuad>.super_TPZGeoQuad.
                   super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes +
            *(long *)((long)pvVar1 + -0x60) + -0x48) = vtt[3];
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TPZQuadSphere
            (&this->fGeo,&cp->fGeo,DestMesh);
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xd8);
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar2);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar2);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xd8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}